

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O2

int debug_cond_wait(void *cond_,void *lock_,timeval *tv)

{
  int iVar1;
  undefined8 uVar2;
  debug_lock *lock;
  char *pcVar3;
  
  if (lock_ == (void *)0x0) {
    pcVar3 = "lock";
    uVar2 = 0x12d;
  }
  else {
    if (*lock_ == -0x214f4ef4) {
      if (evthread_lock_debugging_enabled_ != 0) {
        iVar1 = evthread_is_debug_lock_held_(lock_);
        if (iVar1 == 0) {
          pcVar3 = "evthread_is_debug_lock_held_(lock_)";
          uVar2 = 0x12f;
          goto LAB_0020333e;
        }
      }
      evthread_debug_lock_mark_unlocked(0,(debug_lock *)lock_);
      lock = *(debug_lock **)((long)lock_ + 0x18);
      iVar1 = (*original_cond_fns_.wait_condition)(cond_,lock,tv);
      evthread_debug_lock_mark_locked((uint)lock_,lock);
      return iVar1;
    }
    pcVar3 = "DEBUG_LOCK_SIG == lock->signature";
    uVar2 = 0x12e;
  }
LAB_0020333e:
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
             ,uVar2,pcVar3,"debug_cond_wait");
}

Assistant:

static int
debug_cond_wait(void *cond_, void *lock_, const struct timeval *tv)
{
	int r;
	struct debug_lock *lock = lock_;
	EVUTIL_ASSERT(lock);
	EVUTIL_ASSERT(DEBUG_LOCK_SIG == lock->signature);
	EVLOCK_ASSERT_LOCKED(lock_);
	evthread_debug_lock_mark_unlocked(0, lock);
	r = original_cond_fns_.wait_condition(cond_, lock->lock, tv);
	evthread_debug_lock_mark_locked(0, lock);
	return r;
}